

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O1

string * __thiscall
cmCTestVC::GetNightlyTime_abi_cxx11_(string *__return_storage_ptr__,cmCTestVC *this)

{
  cmCTest *this_00;
  tm *ptVar1;
  size_t sVar2;
  string local_448;
  char current_time [1024];
  
  this_00 = this->CTest;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"NightlyStartTime","");
  cmCTest::GetCTestConfiguration((string *)current_time,this_00,&local_448);
  ptVar1 = cmCTest::GetNightlyTime(this_00,(string *)current_time,this->CTest->TomorrowTag);
  if ((char *)current_time._0_8_ != current_time + 0x10) {
    operator_delete((void *)current_time._0_8_,current_time._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  sprintf(current_time,"%04d-%02d-%02d %02d:%02d:%02d",(ulong)(ptVar1->tm_year + 0x76c),
          (ulong)(ptVar1->tm_mon + 1),(ulong)(uint)ptVar1->tm_mday,(ulong)(uint)ptVar1->tm_hour,
          (ulong)(uint)ptVar1->tm_min,(ulong)(uint)ptVar1->tm_sec);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(current_time);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,current_time,current_time + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestVC::GetNightlyTime()
{
  // Get the nightly start time corresponding to the current dau.
  struct tm* t = this->CTest->GetNightlyTime(
    this->CTest->GetCTestConfiguration("NightlyStartTime"),
    this->CTest->GetTomorrowTag());
  char current_time[1024];
  sprintf(current_time, "%04d-%02d-%02d %02d:%02d:%02d", t->tm_year + 1900,
          t->tm_mon + 1, t->tm_mday, t->tm_hour, t->tm_min, t->tm_sec);
  return std::string(current_time);
}